

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void __thiscall
EthBasePort::EthBasePort
          (EthBasePort *this,int portNum,bool forceFwBridge,ostream *debugStream,EthCallbackType cb)

{
  EthCallbackType cb_local;
  ostream *debugStream_local;
  bool forceFwBridge_local;
  int portNum_local;
  EthBasePort *this_local;
  
  BasePort::BasePort(&this->super_BasePort,portNum,debugStream);
  (this->super_BasePort)._vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_0012cbd8;
  this->useFwBridge = forceFwBridge;
  this->fw_tl = '\0';
  this->eth_read_callback = cb;
  this->ReceiveTimeout = 0.02;
  FPGA_Status::FPGA_Status(&this->FpgaStatus);
  return;
}

Assistant:

EthBasePort::EthBasePort(int portNum, bool forceFwBridge, std::ostream &debugStream, EthCallbackType cb):
    BasePort(portNum, debugStream),
    useFwBridge(forceFwBridge),
    fw_tl(0),
    eth_read_callback(cb),
    ReceiveTimeout(0.02)
{
}